

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManComputeBackward2(Of_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *pCut;
  bool bVar4;
  int FaninId;
  int Required;
  int *pCutMin;
  int iVar;
  int k;
  int i;
  int DelayLut1;
  Gia_Obj_t *pObj;
  Of_Man_t *p_local;
  
  iVar1 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,0);
  p->pPars->Edge = 0;
  p->pPars->Area = 0;
  iVar = p->pGia->nObjs;
  while( true ) {
    iVar = iVar + -1;
    bVar4 = false;
    if (0 < iVar) {
      _i = Gia_ManObj(p->pGia,iVar);
      bVar4 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar2 = Gia_ObjIsAnd(_i);
    if (iVar2 != 0) {
      iVar2 = Of_ObjRequired(p,iVar);
      iVar3 = Gia_ObjIsBuf(_i);
      if (iVar3 == 0) {
        iVar3 = Of_ObjRefNum(p,iVar);
        if (iVar3 != 0) {
          pCut = Of_ObjCutBestP(p,iVar);
          pCutMin._4_4_ = 0;
          while( true ) {
            iVar3 = Of_CutSize(pCut);
            bVar4 = false;
            if (pCutMin._4_4_ < iVar3) {
              pCutMin._0_4_ = Of_CutVar(pCut,pCutMin._4_4_);
              bVar4 = (int)pCutMin != 0;
            }
            if (!bVar4) break;
            Of_ObjUpdateRequired(p,(int)pCutMin,iVar2 - iVar1);
            pCutMin._4_4_ = pCutMin._4_4_ + 1;
          }
          iVar2 = Of_CutSize(pCut);
          p->pPars->Edge = (long)iVar2 + p->pPars->Edge;
          p->pPars->Area = p->pPars->Area + 1;
        }
      }
      else {
        iVar3 = Gia_ObjFaninId0(_i,iVar);
        Of_ObjUpdateRequired(p,iVar3,iVar2);
      }
    }
  }
  return;
}

Assistant:

void Of_ManComputeBackward2( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pCutMin;
    Of_ManComputeOutputRequired( p, 0 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // lookup for the cut
        pCutMin = Of_ObjCutBestP( p, i );
        Of_CutForEachVar( pCutMin, iVar, k )
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}